

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oasis.h
# Opt level: O1

void logprintf(string *program_name,string *msgtype,char *format,...)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  uint uVar5;
  char in_AL;
  uint uVar6;
  undefined8 *puVar7;
  long *plVar8;
  FILE *__stream;
  uint uVar9;
  undefined8 in_RCX;
  ulong *puVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar13;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string __str_1;
  string b2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_2;
  string base;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  char *local_118;
  string *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  paVar2 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar2;
  local_110 = msgtype;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"/\\","");
  std::__cxx11::string::find_last_of
            ((char *)program_name,(ulong)local_1b8._M_dataplus._M_p,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_138,(ulong)program_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/\\","");
  std::__cxx11::string::find_last_of((char *)&local_138,(ulong)local_1d8,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_198,(ulong)&local_138);
  remove_extension<std::__cxx11::string>(&local_1b8,&local_198);
  std::__cxx11::string::operator=((string *)&local_138,(string *)&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  paVar3 = &local_198.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  local_198._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  std::__cxx11::string::append((char *)&local_198);
  uVar6 = getpid();
  uVar4 = -uVar6;
  if (0 < (int)uVar6) {
    uVar4 = uVar6;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar11 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar13 = uVar5;
      uVar9 = (uint)uVar11;
      if (uVar9 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00104951;
      }
      if (uVar9 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00104951;
      }
      if (uVar9 < 10000) goto LAB_00104951;
      uVar11 = uVar11 / 10000;
      uVar5 = uVar13 + 4;
    } while (99999 < uVar9);
    uVar13 = uVar13 + 1;
  }
LAB_00104951:
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar13 - (char)((int)uVar6 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar6 >> 0x1f) + (long)local_1d8),uVar13,uVar4);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    uVar12 = local_198.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_1d0 + local_198._M_string_length) {
    uVar11 = 0xf;
    if (local_1d8 != &local_1c8) {
      uVar11 = local_1c8;
    }
    if (uVar11 < local_1d0 + local_198._M_string_length) goto LAB_001049c0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
  }
  else {
LAB_001049c0:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_1d8);
  }
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1b8.field_2._M_allocated_capacity = *psVar1;
    local_1b8.field_2._8_8_ = puVar7[3];
    local_1b8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar1;
    local_1b8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_1b8._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  std::operator+(&local_108,"log/",&local_138);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_148 = *puVar10;
    lStack_140 = plVar8[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar10;
    local_158 = (ulong *)*plVar8;
  }
  local_150 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar6 = getpid();
  uVar4 = -uVar6;
  if (0 < (int)uVar6) {
    uVar4 = uVar6;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar11 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar13 = uVar5;
      uVar9 = (uint)uVar11;
      if (uVar9 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00104b29;
      }
      if (uVar9 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00104b29;
      }
      if (uVar9 < 10000) goto LAB_00104b29;
      uVar11 = uVar11 / 10000;
      uVar5 = uVar13 + 4;
    } while (99999 < uVar9);
    uVar13 = uVar13 + 1;
  }
LAB_00104b29:
  local_178 = local_168;
  local_118 = format;
  std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar13 - (char)((int)uVar6 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar6 >> 0x1f) + (long)local_178),uVar13,uVar4);
  uVar11 = 0xf;
  if (local_158 != &local_148) {
    uVar11 = local_148;
  }
  if (uVar11 < (ulong)(local_170 + local_150)) {
    uVar11 = 0xf;
    if (local_178 != local_168) {
      uVar11 = local_168[0];
    }
    if ((ulong)(local_170 + local_150) <= uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_158);
      goto LAB_00104bd0;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_178);
LAB_00104bd0:
  puVar10 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar10) {
    local_1c8 = *puVar10;
    uStack_1c0 = puVar7[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *puVar10;
    local_1d8 = (ulong *)*puVar7;
  }
  local_1d0 = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
  plVar8 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar8) {
    local_198.field_2._M_allocated_capacity = *plVar8;
    local_198.field_2._8_8_ = puVar7[3];
    local_198._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_198.field_2._M_allocated_capacity = *plVar8;
    local_198._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_198._M_string_length = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_138,(string *)&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  __stream = fopen(local_138._M_dataplus._M_p,"a");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"%s:%s:",(local_110->_M_dataplus)._M_p,local_1b8._M_dataplus._M_p);
    local_198.field_2._M_allocated_capacity = (size_type)local_e8;
    local_198._M_string_length = (size_type)&__str_1._M_string_length;
    local_198._M_dataplus._M_p = (pointer)0x3000000018;
    vfprintf(__stream,local_118,&local_198);
    fclose(__stream);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  return;
}

Assistant:

inline  void logprintf(const std::string &program_name,const std::string &msgtype,const char* format, ...)
{
	
	std::string base = base_name(program_name);
	base = remove_extension(base_name(base));
	std::string b2 = base + ":" + std::to_string(GETPID());
	base = "log/" + base + "_" + std::to_string(GETPID()) + ".log";

	FILE* fout = fopen(base.c_str(), "a");
	if (fout != nullptr) {
		fprintf(fout, "%s:%s:",msgtype.c_str(),b2.c_str());
		va_list args;
		va_start(args, format);
		vfprintf(fout, format, args);
		va_end(args);
		fclose(fout);
	}
	
}